

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsp.cc
# Opt level: O0

void mcbsp_send(mcbsp_pid_t pid,void *tag,void *payload,mcbsp_size_t size)

{
  bool bVar1;
  uint uVar2;
  mcbsp_size_t size_local;
  void *payload_local;
  void *tag_local;
  mcbsp_pid_t pid_local;
  
  if ((s_spmd == (Spmd *)0x0) || (bVar1 = bsplib::Spmd::closed(s_spmd), bVar1)) {
    bsp_abort("bsp_send: can only be called within SPMD section\n");
  }
  uVar2 = bsplib::Spmd::nprocs(s_spmd);
  if (uVar2 < pid) {
    bsp_abort("bsp_send: The source process ID does not exist\n");
  }
  if (size == 0xffffffffffffffff) {
    bsp_abort("bsp_send: Invalid payload size, because it is also used as end marker\n");
  }
  bsplib::Bsmp::send(s_bsmp,pid,tag,(size_t)payload,(int)size);
  return;
}

Assistant:

void mcbsp_send( mcbsp_pid_t pid, const void * tag, 
             const void * payload, mcbsp_size_t size )
{
    if (!s_spmd || s_spmd->closed())
        bsp_abort("bsp_send: can only be called within SPMD section\n");

    if (pid > mcbsp_pid_t(s_spmd->nprocs()))
        bsp_abort("bsp_send: The source process ID does not exist\n");

    if (size == mcbsp_size_t(-1))
        bsp_abort("bsp_send: Invalid payload size, because it is also "
                 "used as end marker\n");

#ifdef PROFILE
    TicToc t( TicToc::BSMP, s_bsmp->send_tag_size() + size );
#endif

    s_bsmp->send( pid, tag, payload, size );
}